

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_sse42.c
# Opt level: O2

uint32_t adler32_fold_copy_sse42(uint32_t adler,uint8_t *dst,uint8_t *src,size_t len)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 in_XMM3 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  auVar3 = _DAT_00167060;
  auVar2 = _DAT_00167040;
  uVar7 = adler & 0xffff;
  uVar9 = adler >> 0x10;
  auVar10 = pmovsxbw(in_XMM3,0x101010101010101);
  do {
    if (len < 0x10) {
      for (uVar5 = 0; len != uVar5; uVar5 = uVar5 + 1) {
        bVar1 = (*(undefined1 (*) [16])src)[uVar5];
        (*(undefined1 (*) [16])dst)[uVar5] = bVar1;
        uVar7 = uVar7 + bVar1;
        uVar9 = uVar9 + uVar7;
      }
      return uVar9 % 0xfff1 << 0x10 | uVar7 % 0xfff1;
    }
    while (0xf < len) {
      uVar5 = 0x15b0;
      if (len < 0x15b0) {
        uVar5 = len;
      }
      uVar4 = (ulong)((uint)uVar5 & 0x1ff0);
      iVar11 = 0;
      iVar12 = 0;
      iVar13 = 0;
      iVar17 = 0;
      iVar18 = 0;
      iVar19 = 0;
      iVar20 = 0;
      iVar21 = 0;
      iVar22 = 0;
      iVar23 = 0;
      iVar24 = 0;
      uVar8 = uVar4;
      iVar14 = 0;
      iVar15 = 0;
      iVar16 = 0;
      while (0x1f < uVar8) {
        auVar25 = *(undefined1 (*) [16])src;
        auVar26 = *(undefined1 (*) [16])((long)src + 0x10);
        src = (uint8_t *)((long)src + 0x20);
        uVar8 = uVar8 - 0x20;
        auVar27 = psadbw(auVar25,(undefined1  [16])0x0);
        auVar28 = psadbw(auVar26,(undefined1  [16])0x0);
        *(undefined1 (*) [16])dst = auVar25;
        *(undefined1 (*) [16])((long)dst + 0x10) = auVar26;
        dst = (uint8_t *)((long)dst + 0x20);
        auVar25 = pmaddubsw(auVar25,auVar3);
        auVar26 = pmaddubsw(auVar26,auVar2);
        iVar17 = iVar17 + uVar7;
        iVar18 = iVar18 + iVar14;
        iVar19 = iVar19 + iVar15;
        iVar20 = iVar20 + iVar16;
        auVar25 = pmaddwd(auVar25,auVar10);
        auVar26 = pmaddwd(auVar26,auVar10);
        uVar9 = uVar9 + auVar25._0_4_;
        iVar11 = iVar11 + auVar25._4_4_;
        iVar12 = iVar12 + auVar25._8_4_;
        iVar13 = iVar13 + auVar25._12_4_;
        iVar21 = iVar21 + auVar26._0_4_;
        iVar22 = iVar22 + auVar26._4_4_;
        iVar23 = iVar23 + auVar26._8_4_;
        iVar24 = iVar24 + auVar26._12_4_;
        uVar7 = auVar27._0_4_ + uVar7 + auVar28._0_4_;
        iVar14 = auVar27._4_4_ + iVar14 + auVar28._4_4_;
        iVar15 = auVar27._8_4_ + iVar15 + auVar28._8_4_;
        iVar16 = auVar27._12_4_ + iVar16 + auVar28._12_4_;
      }
      iVar17 = uVar9 + iVar21 + iVar17 * 0x20;
      iVar11 = iVar11 + iVar22 + iVar18 * 0x20;
      iVar12 = iVar12 + iVar23 + iVar19 * 0x20;
      iVar13 = iVar13 + iVar24 + iVar20 * 0x20;
      iVar18 = 0;
      iVar19 = 0;
      iVar20 = 0;
      iVar21 = 0;
      for (lVar6 = 0; uVar4 - ((uint)uVar5 & 0x1fe0) != lVar6; lVar6 = lVar6 + 0x10) {
        auVar25 = *(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar6);
        *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + lVar6) = auVar25;
        auVar26 = psadbw(auVar25,(undefined1  [16])0x0);
        auVar25 = pmaddubsw(auVar25,auVar2);
        iVar18 = iVar18 + uVar7;
        iVar19 = iVar19 + iVar14;
        iVar20 = iVar20 + iVar15;
        iVar21 = iVar21 + iVar16;
        auVar25 = pmaddwd(auVar25,auVar10);
        iVar17 = iVar17 + auVar25._0_4_;
        iVar11 = iVar11 + auVar25._4_4_;
        iVar12 = iVar12 + auVar25._8_4_;
        iVar13 = iVar13 + auVar25._12_4_;
        uVar7 = auVar26._0_4_ + uVar7;
        iVar14 = auVar26._4_4_ + iVar14;
        iVar15 = auVar26._8_4_ + iVar15;
        iVar16 = auVar26._12_4_ + iVar16;
      }
      len = len - uVar4;
      auVar25._0_4_ = iVar17 + iVar18 * 0x10;
      auVar25._4_4_ = iVar11 + iVar19 * 0x10;
      auVar25._8_4_ = iVar12 + iVar20 * 0x10;
      auVar25._12_4_ = iVar13 + iVar21 * 0x10;
      auVar25 = phaddd(auVar25,auVar25);
      uVar7 = (iVar15 + uVar7) % 0xfff1;
      auVar25 = phaddd(auVar25,auVar25);
      uVar9 = auVar25._0_4_ % 0xfff1;
      src = *(undefined1 (*) [16])src + lVar6;
      dst = *(undefined1 (*) [16])dst + lVar6;
    }
  } while (len != 0);
  return uVar7 | uVar9 << 0x10;
}

Assistant:

Z_INTERNAL uint32_t adler32_fold_copy_sse42(uint32_t adler, uint8_t *dst, const uint8_t *src, size_t len) {
    uint32_t adler0, adler1;
    adler1 = (adler >> 16) & 0xffff;
    adler0 = adler & 0xffff;

rem_peel:
    if (len < 16) {
       return adler32_copy_len_16(adler0, src, dst, len, adler1);
    }

    __m128i vbuf, vbuf_0;
    __m128i vs1_0, vs3, vs1, vs2, vs2_0, v_sad_sum1, v_short_sum2, v_short_sum2_0,
            v_sad_sum2, vsum2, vsum2_0;
    __m128i zero = _mm_setzero_si128();
    const __m128i dot2v = _mm_setr_epi8(32, 31, 30, 29, 28, 27, 26, 25, 24, 23, 22, 21, 20, 19, 18, 17);
    const __m128i dot2v_0 = _mm_setr_epi8(16, 15, 14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1);
    const __m128i dot3v = _mm_set1_epi16(1);
    size_t k;

    while (len >= 16) {

        k = MIN(len, NMAX);
        k -= k % 16;
        len -= k;

        vs1 = _mm_cvtsi32_si128(adler0);
        vs2 = _mm_cvtsi32_si128(adler1);

        vs3 = _mm_setzero_si128();
        vs2_0 = _mm_setzero_si128();
        vs1_0 = vs1;

        while (k >= 32) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_loadu_si128((__m128i*)src);
            vbuf_0 = _mm_loadu_si128((__m128i*)(src + 16));
            src += 32;
            k -= 32;

            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            v_sad_sum2 = _mm_sad_epu8(vbuf_0, zero);
            _mm_storeu_si128((__m128i*)dst, vbuf);
            _mm_storeu_si128((__m128i*)(dst + 16), vbuf_0);
            dst += 32;

            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v);
            v_short_sum2_0 = _mm_maddubs_epi16(vbuf_0, dot2v_0);

            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);

            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            vsum2_0 = _mm_madd_epi16(v_short_sum2_0, dot3v);
            vs1 = _mm_add_epi32(v_sad_sum2, vs1);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vs2_0 = _mm_add_epi32(vsum2_0, vs2_0);
            vs1_0 = vs1;
        }

        vs2 = _mm_add_epi32(vs2_0, vs2);
        vs3 = _mm_slli_epi32(vs3, 5);
        vs2 = _mm_add_epi32(vs3, vs2);
        vs3 = _mm_setzero_si128();

        while (k >= 16) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_loadu_si128((__m128i*)src);
            src += 16;
            k -= 16;

            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v_0);

            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);
            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vs1_0 = vs1;

            _mm_storeu_si128((__m128i*)dst, vbuf);
            dst += 16;
        }

        vs3 = _mm_slli_epi32(vs3, 4);
        vs2 = _mm_add_epi32(vs2, vs3);

        adler0 = partial_hsum(vs1) % BASE;
        adler1 = hsum(vs2) % BASE;
    }

    /* If this is true, there's fewer than 16 elements remaining */
    if (len) {
        goto rem_peel;
    }

    return adler0 | (adler1 << 16);
}